

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool CoreML::hasIOS14NeuralNetworkFeatures(Model *model)

{
  uint32 uVar1;
  SupportVectorClassifier *pSVar2;
  bool bVar3;
  Type *pTVar4;
  LayerUnion LVar5;
  bool bVar6;
  int index;
  
  bVar3 = hasDefaultValueForOptionalInputs(model);
  bVar6 = true;
  if (!bVar3) {
    uVar1 = model->_oneof_case_[0];
    if (((uVar1 == 0x12f) || (uVar1 == 500)) || (uVar1 == 0x193)) {
      pSVar2 = (model->Type_).supportvectorclassifier_;
      index = 0;
      if (0 < *(int *)&(pSVar2->numberofsupportvectorsperclass_).rep_) {
        do {
          pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                             ((RepeatedPtrFieldBase *)&pSVar2->numberofsupportvectorsperclass_,index
                             );
          uVar1 = pTVar4->_oneof_case_[0];
          if ((int)uVar1 < 0x3d4) {
            if (uVar1 == 0x8c) {
LAB_0027f684:
              LVar5 = pTVar4->layer_;
            }
            else {
              if (uVar1 == 0xd2) {
                LVar5 = pTVar4->layer_;
LAB_0027f627:
                if (((LVar5.convolution_)->dilationfactor_).current_size_ != 0) {
                  return true;
                }
                if (pTVar4->_oneof_case_[0] == 0xd2) {
                  LVar5 = pTVar4->layer_;
                }
                else {
                  LVar5.upsample_ = Specification::UpsampleLayerParams::default_instance();
                }
                if (0 < ((LVar5.convolution_)->stride_).current_size_) {
                  return true;
                }
                if (pTVar4->_oneof_case_[0] == 0x159) goto LAB_0027f663;
                LVar5.reorganizedata_ = Specification::ReorganizeDataLayerParams::default_instance()
                ;
              }
              else {
                if (uVar1 != 0x159) goto LAB_0027f6da;
LAB_0027f663:
                LVar5 = pTVar4->layer_;
              }
              if (*(int *)&((LVar5.convolution_)->kernelsize_).rep_ == 2) {
                return true;
              }
              if (pTVar4->_oneof_case_[0] == 0x8c) goto LAB_0027f684;
              LVar5.innerproduct_ = Specification::InnerProductLayerParams::default_instance();
            }
            if ((LVar5.innerproduct_)->int8dynamicquantize_ != false) {
              return true;
            }
            if (pTVar4->_oneof_case_[0] == 0x415) {
LAB_0027f6a5:
              LVar5 = pTVar4->layer_;
            }
            else {
              LVar5.batchedmatmul_ = Specification::BatchedMatMulLayerParams::default_instance();
            }
            if ((LVar5.batchedmatmul_)->int8dynamicquantize_ != false) {
              return true;
            }
            if (pTVar4->_oneof_case_[0] == 0x3d4) {
LAB_0027f6c6:
              LVar5 = pTVar4->layer_;
            }
            else {
              LVar5.concatnd_ = Specification::ConcatNDLayerParams::default_instance();
            }
            if ((LVar5.concatnd_)->interleave_ != false) {
              return true;
            }
          }
          else {
            if (0x414 < (int)uVar1) {
              if (uVar1 != 0x415) {
                if ((uVar1 - 0x5aa < 0x16) && ((0x318c21U >> (uVar1 - 0x5aa & 0x1f) & 1) != 0)) {
                  return true;
                }
                goto LAB_0027f6da;
              }
              goto LAB_0027f6a5;
            }
            if (uVar1 == 0x3d4) goto LAB_0027f6c6;
            if (uVar1 == 1000) {
              if ((pTVar4->input_).super_RepeatedPtrFieldBase.current_size_ == 7) {
                return true;
              }
              if (*(int *)&((pTVar4->layer_).convolution_)->weights_ != 0) {
                return true;
              }
              LVar5.upsample_ = Specification::UpsampleLayerParams::default_instance();
              goto LAB_0027f627;
            }
          }
LAB_0027f6da:
          index = index + 1;
        } while (index < *(int *)&(pSVar2->numberofsupportvectorsperclass_).rep_);
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CoreML::hasIOS14NeuralNetworkFeatures(const Specification::Model& model) {

    // Return True if the model has the new Neural network features added in
    // ios 14

    if (hasDefaultValueForOptionalInputs(model)) {
        return true;
    }


    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i<layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            switch (layer.layer_case()) {
                case Specification::NeuralNetworkLayer::kCumSum:
                case Specification::NeuralNetworkLayer::kOneHot:
                case Specification::NeuralNetworkLayer::kClampedReLU:
                case Specification::NeuralNetworkLayer::kArgSort:
                case Specification::NeuralNetworkLayer::kPooling3D:
                case Specification::NeuralNetworkLayer::kGlobalPooling3D:
                case Specification::NeuralNetworkLayer::kSliceBySize:
                case Specification::NeuralNetworkLayer::kConvolution3D:
                    return true;
                case Specification::NeuralNetworkLayer::kSliceDynamic:
                    if (layer.input().size() == 7) {
                        return true;
                    } else if (layer.slicedynamic().squeezemasks_size()) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kUpsample:
                    if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                        return true;
                    }
                    if (layer.upsample().fractionalscalingfactor_size() > 0) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kReorganizeData:
                    if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return true;
                    }
                case Specification::NeuralNetworkLayer::kInnerProduct:
                    if (layer.innerproduct().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kBatchedMatmul:
                    if (layer.batchedmatmul().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kConcatND:
                    if (layer.concatnd().interleave()) {
                        return true;
                    }
                default:
                    continue;
            }
        }
    }
    return false;
}